

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

Float pbrt::funcs::rotatedCheckerboard(Point2f p)

{
  undefined1 auVar1 [16];
  Float FVar2;
  undefined1 auVar3 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [16];
  
  auVar4._8_56_ = in_register_00001208;
  auVar4._0_8_ = p.super_Tuple2<pbrt::Point2,_float>;
  auVar1 = vmovshdup_avx(auVar4._0_16_);
  auVar5._0_4_ = auVar1._0_4_ * -0.70710677;
  auVar5._4_4_ = auVar1._4_4_ * 0.70710677;
  auVar5._8_4_ = auVar1._8_4_ * 0.0;
  auVar5._12_4_ = auVar1._12_4_ * 0.0;
  auVar3._0_4_ = p.super_Tuple2<pbrt::Point2,_float>.x;
  auVar3._4_4_ = auVar3._0_4_;
  auVar3._8_4_ = auVar3._0_4_;
  auVar3._12_4_ = auVar3._0_4_;
  auVar1._8_4_ = 0x3f3504f3;
  auVar1._0_8_ = 0x3f3504f33f3504f3;
  auVar1._12_4_ = 0x3f3504f3;
  auVar1 = vfmadd132ps_avx512vl(auVar3,auVar5,auVar1);
  FVar2 = checkerboard((Point2f)auVar1._0_8_);
  return FVar2 / 1.0169845;
}

Assistant:

static Float rotatedCheckerboard(Point2f p) {
    Float angle = Radians(45);
    Float nrm = 1.0169844966464572;
    return checkerboard({p.x * std::cos(angle) - p.y * std::sin(angle),
                         p.x * std::sin(angle) + p.y * std::cos(angle)}) /
           nrm;
}